

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O2

MPP_RET rga_dup_field(RgaCtx ctx,MppFrame frame)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  MppFrameFormat fmt;
  RgaFormat RVar8;
  MPP_RET MVar9;
  undefined8 uVar10;
  undefined2 uVar11;
  short sVar12;
  
  uVar10 = mpp_frame_get_buffer(frame);
  iVar2 = mpp_frame_get_width(frame);
  uVar3 = mpp_frame_get_height(frame);
  iVar4 = mpp_frame_get_hor_stride(frame);
  uVar5 = mpp_frame_get_ver_stride(frame);
  iVar6 = mpp_buffer_get_fd_with_caller(uVar10,"rga_dup_field");
  iVar7 = mpp_buffer_get_ptr_with_caller(uVar10);
  fmt = mpp_frame_get_fmt(frame);
  RVar8 = rga_fmt_map(fmt);
  if (RVar8 != RGA_FMT_YCbCr_420_SP) {
    _mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"fmt == RGA_FMT_YCbCr_420_SP","rga_dup_field",
               0x172);
    if ((DAT_0010a143 & 0x10) != 0) goto LAB_001059e4;
  }
  if (iVar2 == 0 || uVar3 == 0) {
    _mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"width > 0 && height > 0","rga_dup_field",
               0x173);
    if ((DAT_0010a143 & 0x10) != 0) {
LAB_001059e4:
      abort();
    }
  }
  if ((uVar3 == 0 || iVar2 == 0) || RVar8 != RGA_FMT_YCbCr_420_SP) {
    return MPP_NOK;
  }
  memset((void *)((long)ctx + 8),0,0x128);
  *(long *)((long)ctx + 0x10) = (long)iVar6;
  *(undefined4 *)((long)ctx + 0x28) = 10;
  sVar1 = (short)iVar4 * 2;
  *(short *)((long)ctx + 0x34) = sVar1;
  sVar12 = (short)(uVar5 >> 1);
  *(short *)((long)ctx + 0x36) = sVar12;
  *(short *)((long)ctx + 0x2c) = (short)iVar2;
  uVar11 = (undefined2)(uVar3 >> 1);
  *(undefined2 *)((long)ctx + 0x2e) = uVar11;
  *(ulong *)((long)ctx + 0x48) = (ulong)(uint)(iVar7 + iVar4);
  *(short *)((long)ctx + 100) = sVar1;
  *(short *)((long)ctx + 0x66) = sVar12;
  *(undefined4 *)((long)ctx + 0x58) = 10;
  *(short *)((long)ctx + 0x5c) = (short)iVar2;
  *(undefined2 *)((long)ctx + 0x5e) = uVar11;
  *(short *)((long)ctx + 0xb2) = (short)iVar4 * 2 + -1;
  *(short *)((long)ctx + 0xb6) = sVar12 + -1;
  *(undefined1 *)((long)ctx + 0x108) = 1;
  *(undefined4 *)((long)ctx + 0x118) = 0x80000521;
  MVar9 = rga_ioctl((RgaCtxImpl *)ctx);
  return MVar9;
}

Assistant:

MPP_RET rga_dup_field(RgaCtx ctx, MppFrame frame)
{
    MPP_RET ret = MPP_OK;
    RgaCtxImpl *impl = (RgaCtxImpl *)ctx;
    MppBuffer buf = mpp_frame_get_buffer(frame);
    RK_U32 width  = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 h_str  = mpp_frame_get_hor_stride(frame);
    RK_U32 v_str  = mpp_frame_get_ver_stride(frame);
    RK_S32 fd = mpp_buffer_get_fd(buf);
    void *ptr = mpp_buffer_get_ptr(buf);
    RgaFormat fmt = rga_fmt_map(mpp_frame_get_fmt(frame));
    RgaReq *request = &impl->request;

    rga_dbg_func("in\n");

    mpp_assert(fmt == RGA_FMT_YCbCr_420_SP);
    mpp_assert(width > 0 && height > 0);
    if (fmt != RGA_FMT_YCbCr_420_SP || width == 0 || height == 0) {
        ret = MPP_NOK;
        goto END;
    }

    rga_dbg_dup("[fd:w:h:h_str:v_str:fmt] %d:%d:%d:%d:%d:%d\n",
                fd, width, height, h_str, v_str, fmt);

    memset(request, 0, sizeof(*request));
    request->src.yrgb_addr = fd;
    request->src.format = (RK_U32)fmt;
    request->src.vir_w = h_str * 2;
    request->src.vir_h = v_str / 2;
    request->src.act_w = width;
    request->src.act_h = height / 2;

    request->dst.yrgb_addr = 0;
    request->dst.uv_addr = (RK_U32)((uintptr_t)ptr) + h_str; // special process here
    request->dst.vir_w = h_str * 2;
    request->dst.vir_h = v_str / 2;
    request->dst.format = (RK_U32)fmt;
    request->dst.act_w = width;
    request->dst.act_h = height / 2;

    request->clip.xmin = 0;
    request->clip.xmax = h_str * 2 - 1;
    request->clip.ymin = 0;
    request->clip.ymax = v_str / 2 - 1;

    request->mmu_info.mmu_en = 1;
    request->mmu_info.mmu_flag = ((2 & 0x3) << 4) | 1;
    request->mmu_info.mmu_flag |= (1 << 31) | (1 << 10) | (1 << 8);

    ret = rga_ioctl(impl);
END:
    rga_dbg_func("out\n");
    return ret;
}